

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<int,void(int_const&)>::reject<std::shared_ptr<int>&>
          (PromiseDataBase<int,void(int_const&)> *this,shared_ptr<int> *error)

{
  exception_ptr eStack_18;
  
  PromiseError::PromiseError<std::shared_ptr<int>>((PromiseError *)&eStack_18,error);
  std::__exception_ptr::exception_ptr::operator=((exception_ptr *)(this + 0x50),&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  PromiseDataBase<int,_void_(const_int_&)>::setSettled
            ((PromiseDataBase<int,_void_(const_int_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }